

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::RenderDimmedBackgroundBehindWindow(ImGuiWindow *window,ImU32 col)

{
  ImDrawCmd *pIVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  int iVar4;
  ImGuiViewportP *pIVar5;
  ImDrawList *this;
  ImDrawCmd *pIVar6;
  float fVar7;
  float fVar8;
  ImRect viewport_rect;
  ImDrawCmd cmd;
  ImVec2 local_70;
  undefined1 local_68 [16];
  ImDrawCmd local_58;
  
  if (0xffffff < col) {
    pIVar5 = *(GImGui->Viewports).Data;
    IVar2 = (pIVar5->super_ImGuiViewport).Pos;
    IVar3 = (pIVar5->super_ImGuiViewport).Size;
    fVar7 = IVar3.x + IVar2.x;
    fVar8 = IVar3.y + IVar2.y;
    local_68._8_4_ = fVar7;
    local_68._0_4_ = IVar2.x;
    local_68._4_4_ = IVar2.y;
    local_68._12_4_ = fVar8;
    this = window->RootWindow->DrawList;
    if ((this->CmdBuffer).Size == 0) {
      ImDrawList::AddDrawCmd(this);
    }
    local_58.ClipRect.y = IVar2.y + -1.0;
    local_58.ClipRect.x = IVar2.x + -1.0;
    local_70.y = fVar8 + 1.0;
    local_70.x = fVar7 + 1.0;
    ImDrawList::PushClipRect(this,(ImVec2 *)&local_58,&local_70,false);
    ImDrawList::AddRectFilled(this,(ImVec2 *)local_68,(ImVec2 *)(local_68 + 8),col,0.0,0);
    pIVar6 = (this->CmdBuffer).Data;
    iVar4 = (this->CmdBuffer).Size;
    local_58.UserCallbackData = pIVar6[(long)iVar4 + -1].UserCallbackData;
    pIVar1 = pIVar6 + (long)iVar4 + -1;
    local_58.ClipRect.x = (pIVar1->ClipRect).x;
    local_58.ClipRect.y = (pIVar1->ClipRect).y;
    local_58.ClipRect.z = (pIVar1->ClipRect).z;
    local_58.ClipRect.w = (pIVar1->ClipRect).w;
    local_58.TextureId = pIVar6[(long)iVar4 + -1].TextureId;
    local_58._24_8_ = (&pIVar6[(long)iVar4 + -1].TextureId)[1];
    pIVar6 = pIVar6 + (long)iVar4 + -1;
    local_58.ElemCount = pIVar6->ElemCount;
    local_58._36_4_ = *(undefined4 *)&pIVar6->field_0x24;
    local_58.UserCallback = *(ImDrawCallback *)(&pIVar6->ElemCount + 2);
    (this->CmdBuffer).Size = iVar4 + -1;
    ImVector<ImDrawCmd>::push_front(&this->CmdBuffer,&local_58);
    ImDrawList::AddDrawCmd(this);
    ImDrawList::PopClipRect(this);
  }
  return;
}

Assistant:

static void ImGui::RenderDimmedBackgroundBehindWindow(ImGuiWindow* window, ImU32 col)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    ImGuiViewportP* viewport = (ImGuiViewportP*)GetMainViewport();
    ImRect viewport_rect = viewport->GetMainRect();

    // Draw behind window by moving the draw command at the FRONT of the draw list
    {
        // We've already called AddWindowToDrawData() which called DrawList->ChannelsMerge() on DockNodeHost windows,
        // and draw list have been trimmed already, hence the explicit recreation of a draw command if missing.
        // FIXME: This is creating complication, might be simpler if we could inject a drawlist in drawdata at a given position and not attempt to manipulate ImDrawCmd order.
        ImDrawList* draw_list = window->RootWindow->DrawList;
        if (draw_list->CmdBuffer.Size == 0)
            draw_list->AddDrawCmd();
        draw_list->PushClipRect(viewport_rect.Min - ImVec2(1, 1), viewport_rect.Max + ImVec2(1, 1), false); // FIXME: Need to stricty ensure ImDrawCmd are not merged (ElemCount==6 checks below will verify that)
        draw_list->AddRectFilled(viewport_rect.Min, viewport_rect.Max, col);
        ImDrawCmd cmd = draw_list->CmdBuffer.back();
        IM_ASSERT(cmd.ElemCount == 6);
        draw_list->CmdBuffer.pop_back();
        draw_list->CmdBuffer.push_front(cmd);
        draw_list->AddDrawCmd(); // We need to create a command as CmdBuffer.back().IdxOffset won't be correct if we append to same command.
        draw_list->PopClipRect();
    }
}